

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_diamond.cc
# Opt level: O0

void produce<long,disruptor::SingleThreadedStrategy,disruptor::YieldingStrategy<200l>>
               (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
                *s)

{
  long lVar1;
  int64_t *piVar2;
  long *plVar3;
  size_t *psVar4;
  int64_t k_1;
  int k;
  int64_t sequence;
  int64_t i;
  int64_t iterations;
  int64_t *in_stack_ffffffffffffffb8;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
  *in_stack_ffffffffffffffc0;
  int64_t *in_stack_ffffffffffffffc8;
  int64_t *piVar5;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
  *in_stack_ffffffffffffffd0;
  undefined4 local_24;
  undefined8 local_18;
  
  lVar1 = counter * RING_BUFFER_SIZE;
  for (local_18 = 0; local_18 < lVar1; local_18 = local_18 + 1) {
    piVar2 = (int64_t *)
             disruptor::
             Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
             ::Claim(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    piVar5 = piVar2;
    if (piVar2 < delta) {
      for (local_24 = 0; (long)local_24 <= (long)piVar2; local_24 = local_24 + 1) {
        in_stack_ffffffffffffffc0 =
             (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
              *)(long)local_24;
        in_stack_ffffffffffffffd0 =
             (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
              *)(long)local_24;
        plVar3 = disruptor::
                 Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
                 ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        *plVar3 = (long)in_stack_ffffffffffffffc0;
      }
      disruptor::
      Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>::
      Publish(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0)
      ;
    }
    else {
      for (; in_stack_ffffffffffffffc8 = piVar5,
          (int64_t *)((long)piVar2 - delta) < in_stack_ffffffffffffffc8;
          piVar5 = (int64_t *)((long)piVar5 + -1)) {
        piVar5 = in_stack_ffffffffffffffc8;
        psVar4 = (size_t *)
                 disruptor::
                 Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
                 ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
        *psVar4 = (size_t)in_stack_ffffffffffffffc8;
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffc8;
      }
      disruptor::
      Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>::
      Publish(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0)
      ;
    }
  }
  return;
}

Assistant:

void produce(disruptor::Sequencer<T, C, W>& s) {
  int64_t iterations = counter * RING_BUFFER_SIZE;

  for (int64_t i = 0; i < iterations; ++i) {

    int64_t sequence = s.Claim(delta);

    if (sequence < delta) {
      for (int k = 0; k <= sequence; ++k) {
        s[k] = k;
#ifdef PRINT_DEBUG_PROD
        std::stringstream ss;
        ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id()
           << '\n';
        std::cout << ss.str();
#endif
      }

      s.Publish(sequence, delta);
      continue;
    }

    for (int64_t k = sequence; k > sequence - delta; --k) {
      s[k] = k;

#ifdef PRINT_DEBUG_PROD
      std::stringstream ss;
      ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
    }

    s.Publish(sequence, delta);
  }
}